

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_unix_p.cpp
# Opt level: O2

int __thiscall
BamTools::Internal::TcpSocketEngine::nativeSelect(TcpSocketEngine *this,int msecs,bool isRead)

{
  uint __i;
  int iVar1;
  long lVar2;
  fd_set *__writefds;
  fd_set *__readfds;
  timeval *__timeout;
  timeval tv;
  fd_set fds;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.fds_bits[lVar2] = 0;
  }
  iVar1 = this->m_socketDescriptor;
  fds.fds_bits[iVar1 / 0x40] = fds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  tv.tv_sec = (__time_t)(msecs / 1000);
  tv.tv_usec = (__suseconds_t)((msecs % 1000) * 1000);
  __timeout = (timeval *)0x0;
  if (-1 < msecs) {
    __timeout = (timeval *)&tv;
  }
  if (isRead) {
    __readfds = &fds;
    __writefds = (fd_set *)0x0;
  }
  else {
    __writefds = (fd_set *)&fds;
    __readfds = (fd_set *)0x0;
  }
  iVar1 = select(iVar1 + 1,(fd_set *)__readfds,__writefds,(fd_set *)0x0,__timeout);
  return iVar1;
}

Assistant:

int TcpSocketEngine::nativeSelect(int msecs, bool isRead) const
{

    // set up FD set
    fd_set fds;
    FD_ZERO(&fds);
    FD_SET(m_socketDescriptor, &fds);

    // setup our timeout
    timeval tv;
    tv.tv_sec = msecs / 1000;
    tv.tv_usec = (msecs % 1000) * 1000;

    // do 'select'
    if (isRead)
        return select(m_socketDescriptor + 1, &fds, 0, 0, (msecs < 0 ? 0 : &tv));
    else
        return select(m_socketDescriptor + 1, 0, &fds, 0, (msecs < 0 ? 0 : &tv));
}